

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O2

bool contains_valid_namespaces(vw *all,features *f_src1,features *f_src2,interact *in)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  ostream *poVar4;
  uchar uVar5;
  
  pfVar2 = (f_src1->values)._begin;
  if (((f_src1->values)._end != pfVar2) &&
     (pfVar3 = (f_src2->values)._begin, (f_src2->values)._end != pfVar3)) {
    fVar1 = *pfVar2;
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"Namespace \'");
      uVar5 = in->n1;
    }
    else {
      fVar1 = *pfVar3;
      if ((fVar1 == 1.0) && (!NAN(fVar1))) {
        return true;
      }
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,"Namespace \'");
      uVar5 = in->n2;
    }
    poVar4 = std::operator<<(poVar4,uVar5);
    std::operator<<(poVar4,"\' misses anchor feature with value 1");
  }
  return false;
}

Assistant:

bool contains_valid_namespaces(vw& all, features& f_src1, features& f_src2, interact& in)
{
  // first feature must be 1 so we're sure that the anchor feature is present
  if (f_src1.size() == 0 || f_src2.size() == 0)
    return false;

  if (f_src1.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n1 << "' misses anchor feature with value 1";
    return false;
  }

  if (f_src2.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n2 << "' misses anchor feature with value 1";
    return false;
  }

  return true;
}